

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
array<CSkins::CSkin,_allocator_default<CSkins::CSkin>_>::alloc
          (array<CSkins::CSkin,_allocator_default<CSkins::CSkin>_> *this,int new_len)

{
  uint uVar1;
  int iVar2;
  CSkin *pCVar3;
  ulong uVar4;
  ulong uVar5;
  
  this->list_size = new_len;
  pCVar3 = allocator_default<CSkins::CSkin>::alloc_array(new_len);
  uVar1 = this->list_size;
  if (this->num_elements < this->list_size) {
    uVar1 = this->num_elements;
  }
  uVar5 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 * 200 - uVar5 != 0; uVar5 = uVar5 + 200) {
    memcpy(pCVar3->m_aName + (uVar5 - 4),this->list->m_aName + (uVar5 - 4),200);
  }
  allocator_default<CSkins::CSkin>::free_array(this->list);
  iVar2 = this->list_size;
  if (this->num_elements < this->list_size) {
    iVar2 = this->num_elements;
  }
  this->num_elements = iVar2;
  this->list = pCVar3;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}